

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRewrite.c
# Opt level: O3

_Bool ParseCommandLineBoolArg(int *pArgC,char ***pArgV,char *String1,char *String2)

{
  char *__s2;
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  _Bool _Var5;
  ulong uVar6;
  
  uVar4 = *pArgC;
  if ((int)uVar4 < 1) {
    _Var5 = false;
  }
  else {
    uVar6 = 0;
    _Var5 = false;
    do {
      __s2 = (*pArgV)[uVar6];
      iVar1 = strcasecmp(String1,__s2);
      if ((iVar1 == 0) || (iVar1 = strcasecmp(String2,__s2), iVar1 == 0)) {
        uVar4 = uVar4 - 1;
        lVar2 = (long)(int)uVar4;
        if ((long)uVar6 < lVar2) {
          uVar3 = uVar6;
          do {
            (*pArgV)[uVar3] = (*pArgV)[uVar3 + 1];
            uVar3 = uVar3 + 1;
          } while (uVar4 != uVar3);
        }
        *pArgC = uVar4;
        _Var5 = true;
      }
      else {
        lVar2 = (long)(int)uVar4;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < lVar2);
  }
  return _Var5;
}

Assistant:

static
bool
    ParseCommandLineBoolArg
    (
        int*        pArgC,      // [in,out]
        char***     pArgV,      // [in,out]
        char const* String1,    // [in]
        char const* String2     // [in]
    )
{
    bool itemExists = false;

    for( int i=0; i<*pArgC; i++ )
    {
        if(     strcasecmp( String1, (*pArgV)[i] ) == 0
            ||  strcasecmp( String2, (*pArgV)[i] ) == 0 )
        {
            itemExists = true;
            // ripple down remaining items
            for( int x=i; x<(*pArgC)-1; x++ )
            {
                (*pArgV)[x] = (*pArgV)[x+1];
            }
            *pArgC -= 1;
        }
    }

    return itemExists;
}